

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O2

void update(int jobs)

{
  uint __line;
  pointer pfVar1;
  undefined4 uVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  pointer p_Var10;
  _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *p_Var11;
  pointer this;
  char *__assertion;
  int iVar12;
  _State_baseV2 *__tmp;
  string_view command;
  string_view command_00;
  string_view command_01;
  string_view command_02;
  string_view command_03;
  string_view command_04;
  __allocator_type __a2;
  __allocator_type __a2_1;
  vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  threads;
  atomic<int> libs;
  anon_class_40_5_e12f0fb0_for__M_head_impl thread_handler;
  thread local_5e0;
  Map symbol_map;
  File_index_t index_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5a0 [3];
  mutex printer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symbolic_links;
  ofstream db_file;
  _Rb_tree_node_base a_Stack_520 [15];
  ofstream index_file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [31];
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a_file_paths;
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  so_file_paths;
  
  std::operator<<((ostream *)&std::cout,"Generating file list\n");
  std::ostream::flush();
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Thread_safe_queue(&so_file_paths);
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Thread_safe_queue(&a_file_paths);
  symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header;
  symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbolic_links._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  libs.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  command._M_str = "locate -ber lib.*\\.so$";
  command._M_len = 0x16;
  symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  get_output_from_command_abi_cxx11_((string *)&index_file,command);
  std::__cxx11::istringstream::istringstream((istringstream *)&db_file,(string *)&index_file,_S_in);
  std::__cxx11::string::~string((string *)&index_file);
  _index_file = (pointer)local_318;
  _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318[0]._M_local_buf[0] = '\0';
  iVar12 = 0;
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&db_file,(string *)&index_file);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &thread_handler,"file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_file)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &thread_handler,'\"');
    command_00._M_str = (char *)printer.super___mutex_base._M_mutex.__align;
    command_00._M_len = printer.super___mutex_base._M_mutex._8_8_;
    get_output_from_command_abi_cxx11_((string *)&symbol_map,command_00);
    std::__cxx11::string::~string((string *)&printer);
    std::__cxx11::string::~string((string *)&thread_handler);
    lVar5 = std::__cxx11::string::find((char *)&symbol_map,0x12812a);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find((char *)&symbol_map,0x128147);
      if (lVar5 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,'\x01',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &index_file);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_1
                       ,"readlink -f \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &index_file);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threads
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &index_1,'\"');
        command_01._M_str =
             (char *)threads.
                     super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        command_01._M_len =
             (size_t)threads.
                     super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        get_output_from_command_abi_cxx11_((string *)&thread_handler,command_01);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&symbolic_links,(key_type *)&thread_handler);
        std::__cxx11::string::append((string *)pmVar7);
        std::__cxx11::string::~string((string *)&thread_handler);
        std::__cxx11::string::~string((string *)&threads);
        std::__cxx11::string::~string((string *)&index_1);
        std::__cxx11::string::~string((string *)&printer);
      }
    }
    else {
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &so_file_paths.q,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_file);
      iVar12 = iVar12 + 1;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::operator<<(poVar6,'\r');
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)&symbol_map);
  }
  std::__cxx11::string::~string((string *)&index_file);
  std::__cxx11::istringstream::~istringstream((istringstream *)&db_file);
  command_02._M_str = "locate -ber lib.*\\.a$";
  command_02._M_len = 0x15;
  get_output_from_command_abi_cxx11_((string *)&index_file,command_02);
  std::__cxx11::istringstream::istringstream((istringstream *)&db_file,(string *)&index_file,_S_in);
  std::__cxx11::string::~string((string *)&index_file);
  _index_file = (pointer)local_318;
  _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318[0]._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&db_file,(string *)&index_file);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &thread_handler,"file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_file)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &thread_handler,'\"');
    command_03._M_str = (char *)printer.super___mutex_base._M_mutex.__align;
    command_03._M_len = printer.super___mutex_base._M_mutex._8_8_;
    get_output_from_command_abi_cxx11_((string *)&symbol_map,command_03);
    std::__cxx11::string::~string((string *)&printer);
    std::__cxx11::string::~string((string *)&thread_handler);
    lVar5 = std::__cxx11::string::find((char *)&symbol_map,0x128179);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find((char *)&symbol_map,0x128147);
      if (lVar5 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,'\x01',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &index_file);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_1
                       ,"readlink -f \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &index_file);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threads
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &index_1,'\"');
        command_04._M_str =
             (char *)threads.
                     super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        command_04._M_len =
             (size_t)threads.
                     super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        get_output_from_command_abi_cxx11_((string *)&thread_handler,command_04);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&symbolic_links,(key_type *)&thread_handler);
        std::__cxx11::string::append((string *)pmVar7);
        std::__cxx11::string::~string((string *)&thread_handler);
        std::__cxx11::string::~string((string *)&threads);
        std::__cxx11::string::~string((string *)&index_1);
        std::__cxx11::string::~string((string *)&printer);
      }
    }
    else {
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a_file_paths.q
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index_file);
      iVar12 = iVar12 + 1;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::operator<<(poVar6,'\r');
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)&symbol_map);
  }
  std::__cxx11::string::~string((string *)&index_file);
  std::__cxx11::istringstream::~istringstream((istringstream *)&db_file);
  std::__cxx11::string::string((string *)&db_file,(string *)&data_base_path_abi_cxx11_);
  boost::filesystem::create_directory((path *)&db_file);
  std::__cxx11::string::~string((string *)&db_file);
  std::ofstream::ofstream(&db_file,(string *)&symbolic_links_filepath_abi_cxx11_,_S_out|_S_bin);
  std::ofstream::ofstream
            (&index_file,(string *)&symbolic_links_index_filepath_abi_cxx11_,_S_out|_S_bin);
  for (p_Var8 = symbolic_links._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &symbolic_links._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    uVar2 = std::ostream::tellp();
    symbol_map._M_t._M_impl._0_4_ = uVar2;
    std::ostream::write((char *)&index_file,(long)&symbol_map);
    poVar6 = std::operator<<((ostream *)&db_file,(string *)(p_Var8 + 1));
    poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 2));
    std::operator<<(poVar6,'\0');
  }
  plVar9 = (long *)std::ostream::flush();
  if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
    plVar9 = (long *)std::ostream::flush();
    if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
      std::ofstream::~ofstream(&index_file);
      std::ofstream::~ofstream(&db_file);
      iVar12 = Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::size(&so_file_paths);
      iVar3 = Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(&a_file_paths);
      thread_handler.total_libs = iVar3 + iVar12;
      threads.
      super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      threads.
      super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      threads.
      super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      printer.super___mutex_base._M_mutex._16_8_ = 0;
      printer.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      printer.super___mutex_base._M_mutex.__align = 0;
      printer.super___mutex_base._M_mutex._8_8_ = 0;
      printer.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      thread_handler.libs = &libs;
      iVar12 = jobs + -1;
      thread_handler.printer = &printer;
      thread_handler.so_file_paths = &so_file_paths;
      thread_handler.a_file_paths = &a_file_paths;
      std::
      vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::reserve(&threads,(long)iVar12);
      for (; 0 < iVar12; iVar12 = iVar12 + -1) {
        _index_file = (pointer)0x0;
        _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var10 = (pointer)operator_new(0x70);
        _db_file = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&__a2;
        (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00133270;
        *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var10->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x18) = 0;
        *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x20) = 0;
        *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x28) = 0;
        (p_Var10->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_001332c0;
        a_Stack_520[0]._0_8_ = p_Var10;
        p_Var11 = (_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)operator_new(0x48);
        std::__future_base::
        _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_Result(p_Var11);
        *(_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x30) = p_Var11;
        *(mutex **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x38) = thread_handler.printer
        ;
        *(Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x40) = thread_handler.so_file_paths
        ;
        *(Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x48) = thread_handler.a_file_paths;
        *(atomic<int> **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x50) =
             thread_handler.libs;
        *(ulong *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x58) =
             CONCAT44(thread_handler._36_4_,thread_handler.total_libs);
        local_5e0._M_id._M_thread = (id)0;
        ___a2_1 = (long *)operator_new(0x20);
        *___a2_1 = (long)&PTR___State_00133318;
        ___a2_1[1] = (long)&p_Var10->_M_impl;
        ___a2_1[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::_M_run;
        ___a2_1[3] = 0;
        std::thread::_M_start_thread(&local_5e0,&__a2_1,0);
        if (___a2_1 != (long *)0x0) {
          (**(code **)(*___a2_1 + 8))();
        }
        std::thread::operator=
                  ((thread *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x20),&local_5e0);
        std::thread::~thread(&local_5e0);
        a_Stack_520[0]._0_8_ = (pointer)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_generate_cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_generate_cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&db_file);
        symbol_map._M_t._M_impl._0_8_ = 0;
        symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _db_file = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_index_file;
        a_Stack_520[0]._0_8_ = _Stack_320._M_pi;
        _index_file = (pointer)&p_Var10->_M_impl;
        _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_520);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &symbol_map._M_t._M_impl.super__Rb_tree_header);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_index_file ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          p_Var10 = (pointer)operator_new(0x60);
          _db_file = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&__a2_1;
          (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
          (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
          (p_Var10->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_00133358;
          *(undefined8 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 8) = 0;
          *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x10) = 0;
          (p_Var10->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
          *(undefined4 *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x18) = 0;
          (p_Var10->_M_impl)._M_storage._M_storage.__align =
               (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_001333a8;
          a_Stack_520[0]._0_8_ = p_Var10;
          p_Var11 = (_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)operator_new(0x48);
          std::__future_base::
          _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::_Result(p_Var11);
          *(_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x20) = p_Var11;
          *(mutex **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x28) =
               thread_handler.printer;
          *(Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x30) =
               thread_handler.so_file_paths;
          *(Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x38) =
               thread_handler.a_file_paths;
          *(atomic<int> **)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x40) =
               thread_handler.libs;
          *(ulong *)((long)&(p_Var10->_M_impl)._M_storage._M_storage + 0x48) =
               CONCAT44(thread_handler._36_4_,thread_handler.total_libs);
          a_Stack_520[0]._0_8_ = (pointer)0x0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_generate_cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_generate_cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&db_file);
          symbol_map._M_t._M_impl._0_8_ = 0;
          symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          _db_file = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_index_file;
          a_Stack_520[0]._0_8_ = _Stack_320._M_pi;
          _index_file = (pointer)&p_Var10->_M_impl;
          _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_520);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &symbol_map._M_t._M_impl.super__Rb_tree_header);
        }
        std::
        __basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::__basic_future((__basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&index_1,(__state_type *)&index_file);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_320);
        std::
        vector<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>
        ::
        emplace_back<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
                  ((vector<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>
                    *)&threads,
                   (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&index_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_5a0);
      }
      update(int)::$_0::operator()[abi_cxx11_(&symbol_map,&thread_handler);
      pfVar1 = threads.
               super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this = threads.
                  super__Vector_base<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
        std::
        future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::get((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&db_file,this);
        for (p_Var8 = a_Stack_520[0]._M_left; p_Var8 != a_Stack_520;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&symbol_map,(key_type *)(p_Var8 + 1));
          std::__cxx11::string::append((string *)pmVar7);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&db_file);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,'\n');
      poVar6 = std::operator<<(poVar6,"writing results to file ");
      std::operator<<(poVar6,(string *)&data_base_filepath_abi_cxx11_);
      std::ostream::flush();
      std::ofstream::ofstream(&db_file,(string *)&data_base_filepath_abi_cxx11_,_S_out|_S_bin);
      std::ofstream::ofstream
                (&index_file,(string *)&data_base_index_filepath_abi_cxx11_,_S_out|_S_bin);
      for (p_Var8 = symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &symbol_map._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        index_1 = std::ostream::tellp();
        std::ostream::write((char *)&index_file,(long)&index_1);
        poVar6 = std::operator<<((ostream *)&db_file,(string *)(p_Var8 + 1));
        poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 2));
        std::operator<<(poVar6,'\0');
      }
      plVar9 = (long *)std::ostream::flush();
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
        plVar9 = (long *)std::ostream::flush();
        if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
          std::ofstream::~ofstream(&index_file);
          std::ofstream::~ofstream(&db_file);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&symbol_map._M_t);
          std::
          vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~vector(&threads);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&symbolic_links._M_t);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&a_file_paths.q.c);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&so_file_paths.q.c);
          return;
        }
        __assert_fail("db_file.flush()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                      ,0xaa,"void update(int)");
      }
      __assert_fail("index_file.flush()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                    ,0xa9,"void update(int)");
    }
    __assertion = "symbolic_links_index_file.flush()";
    __line = 0x77;
  }
  else {
    __assertion = "symbolic_links_file.flush()";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                ,__line,"void update(int)");
}

Assistant:

void update(int jobs) {
	std::cout << "Generating file list\n" << std::flush;
	Thread_safe_queue<std::string> so_file_paths;
	Thread_safe_queue<std::string> a_file_paths;
	std::map<std::string, std::string> symbolic_links;
	std::atomic<int> libs{0};
	int symbol_counter = 0;
	{
		//add all lib*.so files to queue
		auto &queue = so_file_paths.not_thread_safe_get();
		std::istringstream is(get_output_from_command(R"(locate -ber lib.*\.so$)"));
		for (std::string line; std::getline(is, line);) {
			auto file_type = get_output_from_command("file \"" + line + '"');
			if (file_type.find("ELF 64-bit LSB shared object") != std::string::npos) {
				queue.push(std::move(line));
				std::cout << ++symbol_counter << '\r' << std::flush;
			} else if (file_type.find("symbolic link")) {
				symbolic_links[get_output_from_command("readlink -f \"" + line + '"')] += file_separator + line;
			}
			//else skip
		}
	}
	{
		//add all lib*.a files to queue
		auto &queue = a_file_paths.not_thread_safe_get();
		std::istringstream is(get_output_from_command(R"(locate -ber lib.*\.a$)"));
		for (std::string line; std::getline(is, line);) {
			auto file_type = get_output_from_command("file \"" + line + '"');
			if (file_type.find("current ar archive") != std::string::npos) {
				queue.push(std::move(line));
				std::cout << ++symbol_counter << '\r' << std::flush;
			} else if (file_type.find("symbolic link")) {
				symbolic_links[get_output_from_command("readlink -f \"" + line + '"')] += file_separator + line;
			}
			//else skip
		}
	}
	{
		//create symbolic link file
		boost::filesystem::create_directory(data_base_path);
		std::ofstream symbolic_links_file(symbolic_links_filepath, std::ios_base::out | std::ios::binary);
		std::ofstream symbolic_links_index_file(symbolic_links_index_filepath, std::ios_base::out | std::ios::binary);
		for (const auto &link : symbolic_links) {
			File_index_t index = symbolic_links_file.tellp();
			symbolic_links_index_file.write(any_cast<const char *>(&index), sizeof index);
			symbolic_links_file << link.first << link.second << entry_separator;
		}
		assert(symbolic_links_file.flush());
		assert(symbolic_links_index_file.flush());
	}
	const int total_libs = so_file_paths.size() + a_file_paths.size();

	std::vector<std::future<Map>> threads;
	std::mutex printer;

	//function for each thread to execute, which takes a chunk of paths to scan from the queue and scans them until the queue is empty
	auto thread_handler = [&printer, &so_file_paths, &a_file_paths, &libs, total_libs] {
		Map symbol_map;
		while (!so_file_paths.empty()) {
			auto lib_paths = so_file_paths.pop_n(100);
			for (auto &lib_path : lib_paths) {
				auto added_symbols = add_to_database_so(symbol_map, lib_path);
				std::lock_guard<std::mutex> lock(printer);
				symbols += added_symbols;
				std::cout << "found " << symbols << " symbols in " << ++libs << "/" << total_libs << " libs\r" << std::flush;
			}
		}
		while (!a_file_paths.empty()) {
			auto lib_paths = a_file_paths.pop_n(100);
			for (auto &lib_path : lib_paths) {
				auto added_symbols = add_to_database_a(symbol_map, lib_path);
				std::lock_guard<std::mutex> lock(printer);
				symbols += added_symbols;
				std::cout << "found " << symbols << " symbols in " << ++libs << "/" << total_libs << " libs\r" << std::flush;
			}
		}
		return symbol_map;
	};
	//create threads
	threads.reserve(jobs - 1);
	std::generate_n(std::back_inserter(threads), jobs - 1, [&thread_handler] { return std::async(std::launch::async, thread_handler); });
	auto symbol_map = thread_handler();
	//collect results
	for (auto &t : threads) {
		for (auto &p : t.get()) {
			symbol_map[p.first] += p.second;
		}
	}

	//write results to disk
	std::cout << '\n' << "writing results to file " << data_base_filepath << std::flush;
	std::ofstream db_file(data_base_filepath, std::ios_base::out | std::ios::binary);
	std::ofstream index_file(data_base_index_filepath, std::ios_base::out | std::ios::binary);
	for (auto &p : symbol_map) {
		File_index_t index = db_file.tellp();
		index_file.write(any_cast<const char *>(&index), sizeof index);
		db_file << p.first << p.second << entry_separator;
	}
	assert(index_file.flush());
	assert(db_file.flush());
}